

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O3

REF_STATUS ref_layer_tet_to_pyr(REF_GRID ref_grid,REF_INT pri,REF_INT tet0,REF_INT tet1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_CELL pRVar4;
  REF_INT *pRVar5;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  REF_INT new_pyr;
  REF_INT pri_nodes [27];
  REF_INT tet1_nodes [27];
  REF_INT tet0_nodes [27];
  REF_INT local_1ec;
  REF_INT local_1e8 [28];
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_108 [28];
  int local_98 [30];
  
  uVar6 = ref_cell_nodes(ref_grid->cell[10],pri,local_1e8);
  if (uVar6 != 0) {
    pcVar12 = "pri nodes";
    uVar8 = 0x2ef;
LAB_001f20d9:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar8,
           "ref_layer_tet_to_pyr",(ulong)uVar6,pcVar12);
    return uVar6;
  }
  uVar6 = ref_cell_nodes(ref_grid->cell[8],tet0,local_98);
  if (uVar6 != 0) {
    pcVar12 = "tet0 nodes";
    uVar8 = 0x2f0;
    goto LAB_001f20d9;
  }
  uVar6 = ref_cell_nodes(ref_grid->cell[8],tet1,local_108);
  if (uVar6 != 0) {
    pcVar12 = "tet1 nodes";
    uVar8 = 0x2f1;
    goto LAB_001f20d9;
  }
  pRVar4 = ref_grid->cell[10];
  if (0 < (long)pRVar4->face_per) {
    piVar9 = pRVar4->f2n + 3;
    iVar10 = -1;
    lVar11 = 0;
    do {
      if (piVar9[-3] != *piVar9) {
        iVar7 = local_1e8[*piVar9];
        iVar1 = local_1e8[piVar9[-1]];
        iVar2 = local_1e8[piVar9[-2]];
        iVar3 = local_1e8[piVar9[-3]];
        auVar15._0_4_ =
             (uint)((((iVar3 == local_108[1] || iVar3 == local_108[0]) || iVar3 == local_108[2]) ||
                    ((iVar3 == local_98[3] || iVar3 == local_98[2]) ||
                    (iVar3 == local_98[1] || iVar3 == local_98[0]))) || iVar3 == local_108[3]) *
             -0x80000000;
        auVar15._4_4_ =
             (uint)((((iVar2 == local_108[1] || iVar2 == local_108[0]) || iVar2 == local_108[2]) ||
                    ((iVar2 == local_98[3] || iVar2 == local_98[2]) ||
                    (iVar2 == local_98[1] || iVar2 == local_98[0]))) || iVar2 == local_108[3]) *
             -0x80000000;
        auVar15._8_4_ =
             (uint)((((iVar1 == local_108[1] || iVar1 == local_108[0]) || iVar1 == local_108[2]) ||
                    ((iVar1 == local_98[3] || iVar1 == local_98[2]) ||
                    (iVar1 == local_98[1] || iVar1 == local_98[0]))) || iVar1 == local_108[3]) *
             -0x80000000;
        auVar15._12_4_ =
             (uint)((((iVar7 == local_108[1] || iVar7 == local_108[0]) || iVar7 == local_108[2]) ||
                    ((iVar7 == local_98[3] || iVar7 == local_98[2]) ||
                    (iVar7 == local_98[1] || iVar7 == local_98[0]))) || iVar7 == local_108[3]) *
             -0x80000000;
        iVar7 = movmskps(piVar9[-3],auVar15);
        uVar6 = (uint)(0x4332322132212110 >> ((byte)(iVar7 << 2) & 0x3f)) & 7;
        if ((char)uVar6 != '\x02') {
          if (uVar6 != 4) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x302,"ref_layer_tet_to_pyr","hits not 2 or 4");
            printf("hits %d\n",(ulong)uVar6);
            return 1;
          }
          if (iVar10 != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x304,"ref_layer_tet_to_pyr","two quad faces",0xffffffffffffffff,(long)iVar10);
            return 1;
          }
          iVar10 = (int)lVar11;
        }
      }
      lVar11 = lVar11 + 1;
      piVar9 = piVar9 + 4;
    } while (pRVar4->face_per != lVar11);
    if (iVar10 != -1) {
      pRVar5 = pRVar4->f2n;
      local_178 = local_1e8[pRVar5[iVar10 * 4]];
      local_174 = local_1e8[pRVar5[iVar10 * 4 + 1]];
      local_168 = local_1e8[pRVar5[iVar10 * 4 + 2]];
      local_16c = local_1e8[pRVar5[iVar10 * 4 + 3]];
      iVar10 = -1;
      lVar11 = 0;
      do {
        iVar7 = local_98[lVar11];
        if ((((local_178 != iVar7) && (local_174 != iVar7)) && (local_168 != iVar7)) &&
           ((local_16c != iVar7 &&
            (bVar13 = iVar10 != -1, bVar14 = iVar10 != iVar7, iVar10 = iVar7, bVar14 && bVar13)))) {
          pcVar12 = "multiple off nodes";
          uVar8 = 0x318;
          goto LAB_001f23de;
        }
        iVar7 = local_108[lVar11];
        if (((local_178 != iVar7) && (local_174 != iVar7)) &&
           ((local_168 != iVar7 &&
            ((local_16c != iVar7 &&
             (bVar13 = iVar10 != -1, bVar14 = iVar10 != iVar7, iVar10 = iVar7, bVar14 && bVar13)))))
           ) {
          pcVar12 = "multiple off nodes";
          uVar8 = 0x31e;
          goto LAB_001f23de;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      if (iVar10 != -1) {
        local_170 = iVar10;
        uVar6 = ref_cell_remove(ref_grid->cell[8],tet0);
        if (uVar6 == 0) {
          uVar6 = ref_cell_remove(ref_grid->cell[8],tet1);
          if (uVar6 == 0) {
            uVar6 = ref_cell_add(ref_grid->cell[9],&local_178,&local_1ec);
            if (uVar6 == 0) {
              return 0;
            }
            pcVar12 = "add pyr";
            uVar8 = 0x327;
          }
          else {
            pcVar12 = "rm tet1";
            uVar8 = 0x325;
          }
        }
        else {
          pcVar12 = "rm tet0";
          uVar8 = 0x324;
        }
        goto LAB_001f20d9;
      }
      pcVar12 = "pyramid peak not set";
      uVar8 = 0x322;
      local_170 = -1;
      goto LAB_001f23de;
    }
  }
  pcVar12 = "quad face not set";
  uVar8 = 0x309;
LAB_001f23de:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar8,
         "ref_layer_tet_to_pyr",pcVar12);
  return 1;
}

Assistant:

static REF_FCN REF_STATUS ref_layer_tet_to_pyr(REF_GRID ref_grid, REF_INT pri,
                                               REF_INT tet0, REF_INT tet1) {
  REF_INT pri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet0_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet1_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT pyr_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell_face, i, hits, quad_node, quad_face, new_pyr;

  RSS(ref_cell_nodes(ref_grid_pri(ref_grid), pri, pri_nodes), "pri nodes");
  RSS(ref_cell_nodes(ref_grid_tet(ref_grid), tet0, tet0_nodes), "tet0 nodes");
  RSS(ref_cell_nodes(ref_grid_tet(ref_grid), tet1, tet1_nodes), "tet1 nodes");

  quad_face = REF_EMPTY;
  each_ref_cell_cell_face(ref_grid_pri(ref_grid), cell_face) {
    if (ref_cell_f2n_gen(ref_grid_pri(ref_grid), 0, cell_face) !=
        ref_cell_f2n_gen(ref_grid_pri(ref_grid), 3, cell_face)) {
      hits = 0;
      for (i = 0; i < 4; i++) {
        quad_node =
            pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), i, cell_face)];
        if (quad_node == tet0_nodes[0] || quad_node == tet0_nodes[1] ||
            quad_node == tet0_nodes[2] || quad_node == tet0_nodes[3] ||
            quad_node == tet1_nodes[0] || quad_node == tet1_nodes[1] ||
            quad_node == tet1_nodes[2] || quad_node == tet1_nodes[3])
          hits++;
      }
      RAB(hits == 2 || hits == 4, "hits not 2 or 4",
          { printf("hits %d\n", hits); });
      if (4 == hits) {
        REIS(REF_EMPTY, quad_face, "two quad faces");
        quad_face = cell_face;
      }
    }
  }
  RUS(REF_EMPTY, quad_face, "quad face not set");
  /* aflr winding, quad points into prism */
  pyr_nodes[0] =
      pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), 0, quad_face)];
  pyr_nodes[1] =
      pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), 1, quad_face)];
  pyr_nodes[4] =
      pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), 2, quad_face)];
  pyr_nodes[3] =
      pri_nodes[ref_cell_f2n_gen(ref_grid_pri(ref_grid), 3, quad_face)];
  pyr_nodes[2] = REF_EMPTY;
  for (i = 0; i < 4; i++) {
    if (pyr_nodes[0] != tet0_nodes[i] && pyr_nodes[1] != tet0_nodes[i] &&
        pyr_nodes[4] != tet0_nodes[i] && pyr_nodes[3] != tet0_nodes[i]) {
      RAS(pyr_nodes[2] == REF_EMPTY || pyr_nodes[2] == tet0_nodes[i],
          "multiple off nodes");
      pyr_nodes[2] = tet0_nodes[i];
    }
    if (pyr_nodes[0] != tet1_nodes[i] && pyr_nodes[1] != tet1_nodes[i] &&
        pyr_nodes[4] != tet1_nodes[i] && pyr_nodes[3] != tet1_nodes[i]) {
      RAS(pyr_nodes[2] == REF_EMPTY || pyr_nodes[2] == tet1_nodes[i],
          "multiple off nodes");
      pyr_nodes[2] = tet1_nodes[i];
    }
  }
  RUS(REF_EMPTY, pyr_nodes[2], "pyramid peak not set");

  RSS(ref_cell_remove(ref_grid_tet(ref_grid), tet0), "rm tet0");
  RSS(ref_cell_remove(ref_grid_tet(ref_grid), tet1), "rm tet1");

  RSS(ref_cell_add(ref_grid_pyr(ref_grid), pyr_nodes, &new_pyr), "add pyr");

  return REF_SUCCESS;
}